

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  bool bVar1;
  int iVar2;
  CallReaction reaction;
  undefined4 extraout_var;
  ostream *poVar3;
  char *pcVar4;
  UntypedActionResultHolderBase *pUVar5;
  void *mock_obj;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  LogSeverity severity;
  bool is_excessive;
  bool found;
  void *untyped_action;
  anon_class_48_6_2149f011 handle_failures;
  ExpectationBase *untyped_expectation;
  string local_4e8 [32];
  stringstream why;
  undefined1 local_4b8 [376];
  stringstream ss;
  ostream local_330 [376];
  stringstream loc;
  ostream local_1a8 [376];
  ExpectationBase *this_00;
  undefined4 extraout_var_00;
  
  if ((this->untyped_expectations_).
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->untyped_expectations_).
      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    is_excessive = false;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&why);
    std::__cxx11::stringstream::stringstream((stringstream *)&loc);
    untyped_action = (void *)0x0;
    iVar2 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,untyped_args,&untyped_action,&is_excessive,local_330,local_4b8);
    this_00 = (ExpectationBase *)CONCAT44(extraout_var,iVar2);
    found = this_00 != (ExpectationBase *)0x0;
    untyped_expectation = this_00;
    if (((this_00 == (ExpectationBase *)0x0) || (is_excessive != false)) ||
       (bVar1 = LogIsVisible(kInfo), bVar1)) {
      poVar3 = std::operator<<(local_330,"    Function call: ");
      pcVar4 = Name(this);
      std::operator<<(poVar3,pcVar4);
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,untyped_args,local_330);
      if ((this_00 != (ExpectationBase *)0x0) && (is_excessive == false)) {
        ExpectationBase::DescribeLocationTo(this_00,local_1a8);
      }
      handle_failures.ss = &ss;
      handle_failures.why = &why;
      handle_failures.found = &found;
      handle_failures.untyped_expectation = &untyped_expectation;
      handle_failures.loc = &loc;
      handle_failures.is_excessive = &is_excessive;
      if (untyped_action == (void *)0x0) {
        std::__cxx11::stringbuf::str();
        iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,local_4e8);
        pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_01,iVar2);
        std::__cxx11::string::~string(local_4e8);
      }
      else {
        iVar2 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_action,untyped_args);
        pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_00,iVar2);
      }
      if (pUVar5 != (UntypedActionResultHolderBase *)0x0) {
        (*pUVar5->_vptr_UntypedActionResultHolderBase[2])(pUVar5,local_330);
      }
      UntypedInvokeWith::anon_class_48_6_2149f011::operator()(&handle_failures);
    }
    else if (untyped_action == (void *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&handle_failures,"",(allocator<char> *)local_4e8);
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,&handle_failures);
      pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_05,iVar2);
      std::__cxx11::string::~string((string *)&handle_failures);
    }
    else {
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_action,untyped_args);
      pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_04,iVar2);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&loc);
    std::__cxx11::stringstream::~stringstream((stringstream *)&why);
    goto LAB_0012cbeb;
  }
  mock_obj = MockObject(this);
  reaction = Mock::GetReactionOnUninterestingCalls(mock_obj);
  if (reaction == kWarn) {
    severity = kWarning;
LAB_0012cb53:
    bVar1 = LogIsVisible(severity);
    if (!bVar1) {
      pcVar4 = Name(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&why,pcVar4,(allocator<char> *)&loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     "Function call: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&why);
      iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&why);
      return (UntypedActionResultHolderBase *)CONCAT44(extraout_var_03,iVar2);
    }
  }
  else if (reaction == kAllow) {
    severity = kInfo;
    goto LAB_0012cb53;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  (*this->_vptr_UntypedFunctionMockerBase[5])(this,untyped_args,local_330);
  std::__cxx11::stringbuf::str();
  iVar2 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,untyped_args,&why);
  pUVar5 = (UntypedActionResultHolderBase *)CONCAT44(extraout_var_02,iVar2);
  std::__cxx11::string::~string((string *)&why);
  if (pUVar5 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar5->_vptr_UntypedActionResultHolderBase[2])(pUVar5,local_330);
  }
  std::__cxx11::stringbuf::str();
  ReportUninterestingCall(reaction,(string *)&why);
  std::__cxx11::string::~string((string *)&why);
LAB_0012cbeb:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return pUVar5;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
                ? LogIsVisible(kWarning)
                :
                // Otherwise, the user wants this to be an error, and we
                // should always print detailed information in the error.
                true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(
          untyped_args, "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != nullptr) result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(untyped_args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, "")
               : this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  UntypedActionResultHolderBase* result = nullptr;

  auto perform_action = [&] {
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, ss.str())
               : this->UntypedPerformAction(untyped_action, untyped_args);
  };
  auto handle_failures = [&] {
    ss << "\n" << why.str();

    if (!found) {
      // No expectation matches this call - reports a failure.
      Expect(false, nullptr, -1, ss.str());
    } else if (is_excessive) {
      // We had an upper-bound violation and the failure message is in ss.
      Expect(false, untyped_expectation->file(), untyped_expectation->line(),
             ss.str());
    } else {
      // We had an expected call and the matching expectation is
      // described in ss.
      Log(kInfo, loc.str() + ss.str(), 2);
    }
  };
#if GTEST_HAS_EXCEPTIONS
  try {
    result = perform_action();
  } catch (...) {
    handle_failures();
    throw;
  }
#else
  result = perform_action();
#endif

  if (result != nullptr) result->PrintAsActionResult(&ss);
  handle_failures();
  return result;
}